

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O1

void ucnv_SBCSFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,UConverterToUnicodeArgs *pToUArgs,
                      UErrorCode *pErrorCode)

{
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  UConverter *cnv;
  bool bVar5;
  UErrorCode *pUVar6;
  uint uVar7;
  UChar32 UVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  byte *pbVar15;
  byte bVar16;
  ulong uVar17;
  byte bVar18;
  byte *pbVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  byte bVar23;
  uint uVar24;
  char *pcVar25;
  byte *pbVar26;
  uint8_t *target;
  uint local_78;
  uint local_74;
  UConverterFromUnicodeArgs *local_70;
  long local_68;
  UConverter *local_60;
  UConverterToUnicodeArgs *local_58;
  UErrorCode *local_50;
  UConverterSharedData *local_48;
  uint16_t *local_40;
  UChar *noSource;
  
  local_60 = pToUArgs->converter;
  pbVar15 = (byte *)pToUArgs->source;
  cnv = pFromUArgs->converter;
  target = (uint8_t *)pFromUArgs->target;
  pbVar26 = (byte *)pToUArgs->sourceLimit;
  bVar23 = local_60->toULength;
  if ((char)bVar23 < '\x01') {
    uVar17 = 0;
    uVar13 = 0;
    bVar23 = 0;
  }
  else {
    uVar17 = (ulong)(byte)local_60->mode;
    uVar13 = local_60->toUnicodeStatus;
  }
  local_48 = cnv->sharedData;
  uVar21 = ((uint)bVar23 - (int)(char)uVar17) + ((int)pbVar26 - (int)pbVar15);
  pbVar19 = (byte *)(ulong)uVar21;
  if ((0 < (int)uVar21) && (bVar2 = pbVar26[-1], (char)bVar2 < '\0')) {
    if ((uVar21 == 1) || (-0x41 < (char)bVar2)) {
      pbVar19 = pbVar26 + -1;
      if ((byte)(bVar2 + 0x3e) < 0x2e) {
        pbVar26 = pbVar19;
      }
    }
    else {
      bVar18 = pbVar26[-2];
      pbVar19 = (byte *)(ulong)bVar18;
      if ((bVar18 & 0xf0) == 0xe0) {
        pbVar19 = (byte *)(ulong)(byte)" 000000000000\x1000"[bVar18 & 0xf];
        if (((byte)" 000000000000\x1000"[bVar18 & 0xf] >> (bVar2 >> 5) & 1) != 0) {
          pbVar26 = pbVar26 + -2;
        }
      }
    }
  }
  uVar24 = *(int *)&pFromUArgs->targetLimit - (int)target;
  local_40 = (local_48->mbcs).fromUnicodeTable;
  local_68 = *(long *)((local_48->mbcs).sbcsIndex +
                      (((ulong)(byte)cnv->options & 0xffffffffffffff10) >> 4) * 4 + 0x40);
  uVar21 = (local_48->mbcs).asciiRoundtrips;
  local_74 = (cnv->useFallback == '\0' | 2) << 10;
  bVar2 = (local_48->mbcs).unicodeMask;
  local_70 = pFromUArgs;
  local_58 = pToUArgs;
  local_50 = pErrorCode;
  uVar7 = uVar24;
  if (uVar13 == 0) goto LAB_002d42b1;
  if ((int)uVar24 < 1) goto LAB_002d42b1;
  local_60->toUnicodeStatus = 0;
  local_60->toULength = '\0';
  bVar18 = bVar23;
LAB_002d40d0:
  bVar16 = (byte)uVar17;
  if ((char)bVar23 < (char)bVar16) {
    uVar22 = (ulong)bVar23;
    uVar9 = uVar22;
    pbVar19 = pbVar15;
    do {
      bVar23 = (byte)uVar9;
      if (local_58->sourceLimit <= pbVar19) {
        uVar17 = (ulong)(char)bVar18;
        if ((char)bVar18 < (char)bVar23) {
          do {
            local_60->toUBytes[uVar17] = pbVar15[uVar17 - uVar22];
            uVar17 = uVar17 + 1;
          } while (uVar17 < uVar9);
          pbVar15 = pbVar15 + (uVar17 - uVar22);
        }
        else {
          pbVar15 = pbVar19 + (uVar17 - uVar9);
        }
        local_60->toUnicodeStatus = uVar13;
        local_60->toULength = bVar23;
        local_60->mode = (int)(char)bVar16;
        local_58->source = (char *)pbVar15;
        local_70->target = (char *)target;
        return;
      }
      bVar3 = *pbVar19;
      if (((char)bVar16 < '\x03') || (1 < bVar23)) {
        bVar23 = (char)bVar3 < -0x40;
      }
      else {
        if (bVar16 == 3) {
          bVar23 = '\x01' << (bVar3 >> 5);
          uVar10 = (ulong)(uVar13 & 0xf);
          pcVar25 = " 000000000000\x1000";
        }
        else {
          bVar23 = (byte)(1 << ((byte)uVar13 & 7));
          uVar10 = (ulong)(bVar3 >> 4);
          pcVar25 = "";
        }
        bVar23 = bVar23 & pcVar25[uVar10];
      }
      uVar10 = uVar9;
      if (bVar23 == 0) break;
      pbVar19 = pbVar19 + 1;
      uVar13 = uVar13 * 0x40 + (uint)bVar3;
      uVar9 = uVar9 + 1;
      uVar10 = uVar17;
    } while ((char)uVar9 < (char)bVar16);
    bVar23 = (byte)uVar10;
    pbVar15 = pbVar19;
  }
  lVar12 = (long)(char)bVar23;
  if (bVar23 != bVar16) {
    lVar14 = (long)(char)bVar18;
    if ((char)bVar18 < (char)bVar23) {
      do {
        local_60->toUBytes[lVar14] = pbVar15[lVar14 - lVar12];
        lVar14 = lVar14 + 1;
      } while (lVar14 < lVar12);
      lVar14 = lVar14 - lVar12;
    }
    else {
      lVar14 = lVar14 - lVar12;
    }
    local_60->toULength = bVar23;
    local_58->source = (char *)(pbVar15 + lVar14);
    local_70->target = (char *)target;
    *local_50 = U_ILLEGAL_CHAR_FOUND;
    return;
  }
  uVar13 = uVar13 - utf8_offsets[lVar12];
  if (('\x03' < (char)bVar23) && (pbVar19 = (byte *)0x0, uVar20 = uVar13, (bVar2 & 1) == 0))
  goto LAB_002d441e;
  uVar7 = (uVar13 & 0xf) + (uint)local_40[(uVar13 >> 4 & 0x3f) + (uint)local_40[(int)uVar13 >> 10]];
LAB_002d4414:
  pbVar19 = (byte *)(ulong)*(ushort *)(local_68 + (ulong)uVar7 * 2);
  uVar20 = uVar13;
LAB_002d441e:
  pUVar6 = local_50;
  local_78 = (uint)pbVar19;
  if ((local_78 & 0xffff) < local_74) {
    noSource = L"";
    UVar8 = _extFromU(cnv,cnv->sharedData,uVar20,&noSource,L"",&target,target + uVar24,
                      (int32_t **)0x0,-1,local_70->flush,local_50);
    if (*pUVar6 < U_ILLEGAL_ARGUMENT_ERROR) {
      if (cnv->preFromUFirstCP < 0) {
        uVar24 = *(int *)&local_70->targetLimit - (int)target;
        bVar5 = true;
      }
      else {
        *local_50 = U_USING_DEFAULT_WARNING;
        bVar5 = false;
      }
    }
    else {
      cnv->fromUChar32 = UVar8;
      bVar5 = false;
    }
    pbVar19 = (byte *)(ulong)local_78;
    uVar7 = uVar24;
    if (!bVar5) {
LAB_002d43ea:
      if (((*local_50 < U_ILLEGAL_ARGUMENT_ERROR) && (cnv->preFromUFirstCP < 0)) &&
         (pbVar26 = (byte *)local_58->sourceLimit, pbVar15 < pbVar26)) {
        bVar23 = *pbVar15;
        uVar13 = (uint)bVar23;
        local_60->toUBytes[0] = bVar23;
        iVar11 = 1;
        if (((char)bVar23 < '\0') && (iVar11 = 0, (byte)(bVar23 + 0x3e) < 0x33)) {
          iVar11 = ((uint)(0xdf < bVar23) - (uint)(bVar23 < 0xf0)) + 3;
        }
        pbVar19 = pbVar15 + 1;
        lVar12 = 1;
        if (pbVar19 < pbVar26) {
          lVar12 = 1;
          do {
            bVar23 = pbVar15[lVar12];
            local_60->toUBytes[(char)lVar12] = bVar23;
            uVar13 = uVar13 * 0x40 + (uint)bVar23;
            lVar12 = lVar12 + 1;
          } while ((long)pbVar26 - (long)pbVar15 != lVar12);
          pbVar19 = pbVar15 + lVar12;
        }
        local_60->toUnicodeStatus = uVar13;
        local_60->toULength = (int8_t)lVar12;
        local_60->mode = iVar11;
        pbVar15 = pbVar19;
      }
      local_58->source = (char *)pbVar15;
      local_70->target = (char *)target;
      return;
    }
  }
  else {
    *target = (uint8_t)pbVar19;
    target = target + 1;
    uVar7 = uVar24 - 1;
  }
LAB_002d42b1:
  do {
    if (pbVar26 <= pbVar15) goto LAB_002d43ea;
    lVar12 = 0;
    uVar24 = uVar7;
LAB_002d42bf:
    if ((int)uVar24 < 1) {
      *local_50 = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_002d43e7;
    }
    bVar18 = pbVar15[lVar12];
    uVar13 = (uint)bVar18;
    if (-1 < (char)bVar18) {
      if ((uVar21 >> (bVar18 >> 2 & 0x1f) & 1) != 0) break;
      uVar7 = (local_48->mbcs).sbcsIndex[0] + uVar13;
      pbVar15 = pbVar15 + lVar12 + 1;
      goto LAB_002d4414;
    }
    if (bVar18 < 0xe0) {
      if ((bVar18 < 0xc2) || (uVar20 = pbVar15[lVar12 + 1] ^ 0x80, 0x3f < (byte)uVar20)) {
LAB_002d4585:
        pbVar15 = pbVar15 + lVar12 + 1;
        uVar20 = 0xffffffff;
        goto LAB_002d4590;
      }
      uVar4 = *(ushort *)
               (local_68 + (ulong)((local_48->mbcs).sbcsIndex[uVar13 & 0x1f] + uVar20) * 2);
      pbVar19 = (byte *)(ulong)uVar4;
      if (uVar4 < (ushort)local_74) goto LAB_002d45f2;
      lVar14 = lVar12 + 2;
    }
    else {
      if (((bVar18 != 0xe0) ||
          (uVar17 = (ulong)pbVar15[lVar12 + 1] ^ 0x80, ((byte)uVar17 & 0xe0) != 0x20)) ||
         (uVar20 = pbVar15[lVar12 + 2] ^ 0x80, 0x3f < (byte)uVar20)) goto LAB_002d4585;
      uVar4 = *(ushort *)(local_68 + (ulong)((local_48->mbcs).sbcsIndex[uVar17] + uVar20) * 2);
      pbVar19 = (byte *)(ulong)uVar4;
      if (uVar4 < (ushort)local_74) {
        uVar20 = (int)uVar17 << 6 | uVar20;
        pbVar15 = pbVar15 + lVar12 + 3;
        goto LAB_002d4590;
      }
      lVar14 = lVar12 + 3;
    }
    pbVar15 = pbVar15 + lVar14;
    *target = (uint8_t)pbVar19;
    target = target + 1;
    uVar7 = ~(uint)lVar12 + uVar7;
  } while( true );
  puVar1 = target + 1;
  *target = bVar18;
  uVar24 = uVar24 - 1;
  lVar14 = lVar12 + 1;
  lVar12 = lVar12 + 1;
  target = puVar1;
  if (pbVar26 <= pbVar15 + lVar14) {
LAB_002d43e7:
    pbVar15 = pbVar15 + lVar12;
    goto LAB_002d43ea;
  }
  goto LAB_002d42bf;
LAB_002d45f2:
  uVar20 = (uVar13 & 0x1f) << 6 | uVar20;
  pbVar15 = pbVar15 + lVar12 + 2;
LAB_002d4590:
  if ((int)uVar20 < 0) {
    bVar23 = 1;
    uVar17 = 0;
    if ((byte)(bVar18 + 0x3e) < 0x33) {
      uVar17 = (ulong)(byte)(((0xdf < bVar18) - (bVar18 < 0xf0)) + 3);
    }
    bVar18 = 0;
    goto LAB_002d40d0;
  }
  goto LAB_002d441e;
}

Assistant:

static void U_CALLCONV
ucnv_SBCSFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,
                  UConverterToUnicodeArgs *pToUArgs,
                  UErrorCode *pErrorCode) {
    UConverter *utf8, *cnv;
    const uint8_t *source, *sourceLimit;
    uint8_t *target;
    int32_t targetCapacity;

    const uint16_t *table, *sbcsIndex;
    const uint16_t *results;

    int8_t oldToULength, toULength, toULimit;

    UChar32 c;
    uint8_t b, t1, t2;

    uint32_t asciiRoundtrips;
    uint16_t value, minValue = 0;
    UBool hasSupplementary;

    /* set up the local pointers */
    utf8=pToUArgs->converter;
    cnv=pFromUArgs->converter;
    source=(uint8_t *)pToUArgs->source;
    sourceLimit=(uint8_t *)pToUArgs->sourceLimit;
    target=(uint8_t *)pFromUArgs->target;
    targetCapacity=(int32_t)(pFromUArgs->targetLimit-pFromUArgs->target);

    table=cnv->sharedData->mbcs.fromUnicodeTable;
    sbcsIndex=cnv->sharedData->mbcs.sbcsIndex;
    if((cnv->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        results=(uint16_t *)cnv->sharedData->mbcs.swapLFNLFromUnicodeBytes;
    } else {
        results=(uint16_t *)cnv->sharedData->mbcs.fromUnicodeBytes;
    }
    asciiRoundtrips=cnv->sharedData->mbcs.asciiRoundtrips;

    if(cnv->useFallback) {
        /* use all roundtrip and fallback results */
        minValue=0x800;
    } else {
        /* use only roundtrips and fallbacks from private-use characters */
        minValue=0xc00;
    }
    hasSupplementary=(UBool)(cnv->sharedData->mbcs.unicodeMask&UCNV_HAS_SUPPLEMENTARY);

    /* get the converter state from the UTF-8 UConverter */
    if(utf8->toULength > 0) {
        toULength=oldToULength=utf8->toULength;
        toULimit=(int8_t)utf8->mode;
        c=(UChar32)utf8->toUnicodeStatus;
    } else {
        toULength=oldToULength=toULimit=0;
        c = 0;
    }

    // The conversion loop checks source<sourceLimit only once per 1/2/3-byte character.
    // If the buffer ends with a truncated 2- or 3-byte sequence,
    // then we reduce the sourceLimit to before that,
    // and collect the remaining bytes after the conversion loop.
    {
        // Do not go back into the bytes that will be read for finishing a partial
        // sequence from the previous buffer.
        int32_t length=(int32_t)(sourceLimit-source) - (toULimit-oldToULength);
        if(length>0) {
            uint8_t b1=*(sourceLimit-1);
            if(U8_IS_SINGLE(b1)) {
                // common ASCII character
            } else if(U8_IS_TRAIL(b1) && length>=2) {
                uint8_t b2=*(sourceLimit-2);
                if(0xe0<=b2 && b2<0xf0 && U8_IS_VALID_LEAD3_AND_T1(b2, b1)) {
                    // truncated 3-byte sequence
                    sourceLimit-=2;
                }
            } else if(0xc2<=b1 && b1<0xf0) {
                // truncated 2- or 3-byte sequence
                --sourceLimit;
            }
        }
    }

    if(c!=0 && targetCapacity>0) {
        utf8->toUnicodeStatus=0;
        utf8->toULength=0;
        goto moreBytes;
        /*
         * Note: We could avoid the goto by duplicating some of the moreBytes
         * code, but only up to the point of collecting a complete UTF-8
         * sequence; then recurse for the toUBytes[toULength]
         * and then continue with normal conversion.
         *
         * If so, move this code to just after initializing the minimum
         * set of local variables for reading the UTF-8 input
         * (utf8, source, target, limits but not cnv, table, minValue, etc.).
         *
         * Potential advantages:
         * - avoid the goto
         * - oldToULength could become a local variable in just those code blocks
         *   that deal with buffer boundaries
         * - possibly faster if the goto prevents some compiler optimizations
         *   (this would need measuring to confirm)
         * Disadvantage:
         * - code duplication
         */
    }

    /* conversion loop */
    while(source<sourceLimit) {
        if(targetCapacity>0) {
            b=*source++;
            if(U8_IS_SINGLE(b)) {
                /* convert ASCII */
                if(IS_ASCII_ROUNDTRIP(b, asciiRoundtrips)) {
                    *target++=(uint8_t)b;
                    --targetCapacity;
                    continue;
                } else {
                    c=b;
                    value=SBCS_RESULT_FROM_UTF8(sbcsIndex, results, 0, c);
                }
            } else {
                if(b<0xe0) {
                    if( /* handle U+0080..U+07FF inline */
                        b>=0xc2 &&
                        (t1=(uint8_t)(*source-0x80)) <= 0x3f
                    ) {
                        c=b&0x1f;
                        ++source;
                        value=SBCS_RESULT_FROM_UTF8(sbcsIndex, results, c, t1);
                        if(value>=minValue) {
                            *target++=(uint8_t)value;
                            --targetCapacity;
                            continue;
                        } else {
                            c=(c<<6)|t1;
                        }
                    } else {
                        c=-1;
                    }
                } else if(b==0xe0) {
                    if( /* handle U+0800..U+0FFF inline */
                        (t1=(uint8_t)(source[0]-0x80)) <= 0x3f && t1 >= 0x20 &&
                        (t2=(uint8_t)(source[1]-0x80)) <= 0x3f
                    ) {
                        c=t1;
                        source+=2;
                        value=SBCS_RESULT_FROM_UTF8(sbcsIndex, results, c, t2);
                        if(value>=minValue) {
                            *target++=(uint8_t)value;
                            --targetCapacity;
                            continue;
                        } else {
                            c=(c<<6)|t2;
                        }
                    } else {
                        c=-1;
                    }
                } else {
                    c=-1;
                }

                if(c<0) {
                    /* handle "complicated" and error cases, and continuing partial characters */
                    oldToULength=0;
                    toULength=1;
                    toULimit=U8_COUNT_BYTES_NON_ASCII(b);
                    c=b;
moreBytes:
                    while(toULength<toULimit) {
                        /*
                         * The sourceLimit may have been adjusted before the conversion loop
                         * to stop before a truncated sequence.
                         * Here we need to use the real limit in case we have two truncated
                         * sequences at the end.
                         * See ticket #7492.
                         */
                        if(source<(uint8_t *)pToUArgs->sourceLimit) {
                            b=*source;
                            if(icu::UTF8::isValidTrail(c, b, toULength, toULimit)) {
                                ++source;
                                ++toULength;
                                c=(c<<6)+b;
                            } else {
                                break; /* sequence too short, stop with toULength<toULimit */
                            }
                        } else {
                            /* store the partial UTF-8 character, compatible with the regular UTF-8 converter */
                            source-=(toULength-oldToULength);
                            while(oldToULength<toULength) {
                                utf8->toUBytes[oldToULength++]=*source++;
                            }
                            utf8->toUnicodeStatus=c;
                            utf8->toULength=toULength;
                            utf8->mode=toULimit;
                            pToUArgs->source=(char *)source;
                            pFromUArgs->target=(char *)target;
                            return;
                        }
                    }

                    if(toULength==toULimit) {
                        c-=utf8_offsets[toULength];
                        if(toULength<=3) {  /* BMP */
                            value=MBCS_SINGLE_RESULT_FROM_U(table, results, c);
                        } else {
                            /* supplementary code point */
                            if(!hasSupplementary) {
                                /* BMP-only codepages are stored without stage 1 entries for supplementary code points */
                                value=0;
                            } else {
                                value=MBCS_SINGLE_RESULT_FROM_U(table, results, c);
                            }
                        }
                    } else {
                        /* error handling: illegal UTF-8 byte sequence */
                        source-=(toULength-oldToULength);
                        while(oldToULength<toULength) {
                            utf8->toUBytes[oldToULength++]=*source++;
                        }
                        utf8->toULength=toULength;
                        pToUArgs->source=(char *)source;
                        pFromUArgs->target=(char *)target;
                        *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                        return;
                    }
                }
            }

            if(value>=minValue) {
                /* output the mapping for c */
                *target++=(uint8_t)value;
                --targetCapacity;
            } else {
                /* value<minValue means c is unassigned (unmappable) */
                /*
                 * Try an extension mapping.
                 * Pass in no source because we don't have UTF-16 input.
                 * If we have a partial match on c, we will return and revert
                 * to UTF-8->UTF-16->charset conversion.
                 */
                static const UChar nul=0;
                const UChar *noSource=&nul;
                c=_extFromU(cnv, cnv->sharedData,
                            c, &noSource, noSource,
                            &target, target+targetCapacity,
                            NULL, -1,
                            pFromUArgs->flush,
                            pErrorCode);

                if(U_FAILURE(*pErrorCode)) {
                    /* not mappable or buffer overflow */
                    cnv->fromUChar32=c;
                    break;
                } else if(cnv->preFromUFirstCP>=0) {
                    /*
                     * Partial match, return and revert to pivoting.
                     * In normal from-UTF-16 conversion, we would just continue
                     * but then exit the loop because the extension match would
                     * have consumed the source.
                     */
                    *pErrorCode=U_USING_DEFAULT_WARNING;
                    break;
                } else {
                    /* a mapping was written to the target, continue */

                    /* recalculate the targetCapacity after an extension mapping */
                    targetCapacity=(int32_t)(pFromUArgs->targetLimit-(char *)target);
                }
            }
        } else {
            /* target is full */
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    /*
     * The sourceLimit may have been adjusted before the conversion loop
     * to stop before a truncated sequence.
     * If so, then collect the truncated sequence now.
     */
    if(U_SUCCESS(*pErrorCode) &&
            cnv->preFromUFirstCP<0 &&
            source<(sourceLimit=(uint8_t *)pToUArgs->sourceLimit)) {
        c=utf8->toUBytes[0]=b=*source++;
        toULength=1;
        toULimit=U8_COUNT_BYTES(b);
        while(source<sourceLimit) {
            utf8->toUBytes[toULength++]=b=*source++;
            c=(c<<6)+b;
        }
        utf8->toUnicodeStatus=c;
        utf8->toULength=toULength;
        utf8->mode=toULimit;
    }

    /* write back the updated pointers */
    pToUArgs->source=(char *)source;
    pFromUArgs->target=(char *)target;
}